

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cpp
# Opt level: O0

size_t Corrade::Utility::Unicode::utf8(char32_t character,ArrayView4<char> result)

{
  byte bVar1;
  byte *pbVar2;
  ArrayView4<char> AStack_18;
  char32_t character_local;
  ArrayView4<char> result_local;
  
  bVar1 = (byte)character;
  AStack_18._data = result._data;
  if ((uint)character < 0x80) {
    pbVar2 = (byte *)Containers::StaticArrayView<4UL,_char>::operator[]<int,_0>
                               (&stack0xffffffffffffffe8,0);
    *pbVar2 = bVar1 & 0x7f;
    result_local._data = (char *)0x1;
  }
  else if ((uint)character < 0x800) {
    pbVar2 = (byte *)Containers::StaticArrayView<4UL,_char>::operator[]<int,_0>
                               (&stack0xffffffffffffffe8,0);
    *pbVar2 = (byte)((uint)character >> 6) & 0x1f | 0xc0;
    pbVar2 = (byte *)Containers::StaticArrayView<4UL,_char>::operator[]<int,_0>
                               (&stack0xffffffffffffffe8,1);
    *pbVar2 = bVar1 & 0x3f | 0x80;
    result_local._data = (char *)0x2;
  }
  else if ((uint)character < 0x10000) {
    pbVar2 = (byte *)Containers::StaticArrayView<4UL,_char>::operator[]<int,_0>
                               (&stack0xffffffffffffffe8,0);
    *pbVar2 = (byte)((uint)character >> 0xc) & 0xf | 0xe0;
    pbVar2 = (byte *)Containers::StaticArrayView<4UL,_char>::operator[]<int,_0>
                               (&stack0xffffffffffffffe8,1);
    *pbVar2 = (byte)((uint)character >> 6) & 0x3f | 0x80;
    pbVar2 = (byte *)Containers::StaticArrayView<4UL,_char>::operator[]<int,_0>
                               (&stack0xffffffffffffffe8,2);
    *pbVar2 = bVar1 & 0x3f | 0x80;
    result_local._data = (char *)0x3;
  }
  else if ((uint)character < 0x110000) {
    pbVar2 = (byte *)Containers::StaticArrayView<4UL,_char>::operator[]<int,_0>
                               (&stack0xffffffffffffffe8,0);
    *pbVar2 = (byte)((uint)character >> 0x12) & 7 | 0xf0;
    pbVar2 = (byte *)Containers::StaticArrayView<4UL,_char>::operator[]<int,_0>
                               (&stack0xffffffffffffffe8,1);
    *pbVar2 = (byte)((uint)character >> 0xc) & 0x3f | 0x80;
    pbVar2 = (byte *)Containers::StaticArrayView<4UL,_char>::operator[]<int,_0>
                               (&stack0xffffffffffffffe8,2);
    *pbVar2 = (byte)((uint)character >> 6) & 0x3f | 0x80;
    pbVar2 = (byte *)Containers::StaticArrayView<4UL,_char>::operator[]<int,_0>
                               (&stack0xffffffffffffffe8,3);
    *pbVar2 = bVar1 & 0x3f | 0x80;
    result_local._data = (char *)0x4;
  }
  else {
    result_local._data = (char *)0x0;
  }
  return (size_t)result_local._data;
}

Assistant:

std::size_t utf8(const char32_t character, const Containers::ArrayView4<char> result) {
    if(character < U'\x00000080') {
        result[0] = 0x00 | ((character >>  0) & 0x7f);
        return 1;
    }

    if(character < U'\x00000800') {
        result[0] = 0xc0 | ((character >>  6) & 0x1f);
        result[1] = 0x80 | ((character >>  0) & 0x3f);
        return 2;
    }

    if(character < U'\x00010000') {
        result[0] = 0xe0 | ((character >> 12) & 0x0f);
        result[1] = 0x80 | ((character >>  6) & 0x3f);
        result[2] = 0x80 | ((character >>  0) & 0x3f);
        return 3;
    }

    if(character < U'\x00110000') {
        result[0] = 0xf0 | ((character >> 18) & 0x07);
        result[1] = 0x80 | ((character >> 12) & 0x3f);
        result[2] = 0x80 | ((character >>  6) & 0x3f);
        result[3] = 0x80 | ((character >>  0) & 0x3f);
        return 4;
    }

    /* Value outside of UTF-32 range */
    return 0;
}